

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_uqadd_s32_aarch64(CPUARMState_conflict *env,uint32_t a,uint32_t b)

{
  long lVar1;
  uint32_t uVar2;
  
  lVar1 = (ulong)b + (long)(int)a;
  uVar2 = 0xffffffff;
  if (lVar1 < 0x100000000) {
    if (-1 < lVar1) {
      return (uint32_t)lVar1;
    }
    uVar2 = 0;
  }
  (env->vfp).qc[0] = 1;
  return uVar2;
}

Assistant:

uint32_t HELPER(neon_uqadd_s32)(CPUARMState *env, uint32_t a, uint32_t b)
{
    int64_t va = (int32_t)a;
    int64_t vb = (uint32_t)b;
    int64_t vr = va + vb;
    if (vr > UINT32_MAX) {
        SET_QC();
        vr = UINT32_MAX;
    } else if (vr < 0) {
        SET_QC();
        vr = 0;
    }
    return vr;
}